

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>
::Intrusive_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          Column_settings *colSettings)

{
  ID_index rowIndex;
  bool bVar1;
  size_type sVar2;
  reference puVar3;
  Dimension local_68;
  undefined1 local_48 [20];
  ID_index id;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  Column_settings *colSettings_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices_local;
  Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  *this_local;
  
  Dummy_row_access::Dummy_row_access((Dummy_row_access *)this);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(nonZeroRowIndices);
  if (sVar2 == 0) {
    local_68 = 0;
  }
  else {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(nonZeroRowIndices);
    local_68 = (int)sVar2 + -1;
  }
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)this,local_68);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,0,0);
  boost::intrusive::
  set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::set_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
  ::set((set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::set_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)1>_>_>_>
         *)(this + 8));
  *(undefined8 *)(this + 0x28) = 0;
  *(Column_settings **)(this + 0x30) = colSettings;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(nonZeroRowIndices);
  register0x00000000 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(nonZeroRowIndices);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)(local_48 + 0x10));
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    rowIndex = *puVar3;
    local_48._12_4_ = rowIndex;
    boost::intrusive::
    bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    ::end((bstbase3<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>::Matrix_column_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
           *)local_48);
    Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
    ::_insert_entry((Intrusive_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                     *)this,rowIndex,(iterator *)local_48);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline Intrusive_set_column<Master_matrix>::Intrusive_set_column(const Container& nonZeroRowIndices,
                                                                 Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt(),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _insert_entry(id, column_.end());
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _insert_entry(operators_->get_value(p.second), p.first, column_.end());
    }
  }
}